

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::ArrayWithPreallocation
          (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *this,
          ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *other)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  
  this->numActive = 0;
  this->numAllocated = 4;
  uVar1 = other->numAllocated;
  if (4 < uVar1) {
    this->items = other->items;
    this->numActive = other->numActive;
    this->numAllocated = uVar1;
    other->items = (pool_ref<soul::AST::Expression> *)other->space;
    other->numAllocated = 4;
    other->numActive = 0;
    return;
  }
  this->items = (pool_ref<soul::AST::Expression> *)this->space;
  sVar2 = other->numActive;
  this->numActive = sVar2;
  if (sVar2 != 0) {
    sVar3 = 0;
    do {
      this->items[sVar3].object = other->items[sVar3].object;
      sVar3 = sVar3 + 1;
    } while (sVar2 != sVar3);
  }
  return;
}

Assistant:

ArrayWithPreallocation (ArrayWithPreallocation&& other) noexcept
    {
        if (other.isHeapAllocated())
        {
            items = other.items;
            numActive = other.numActive;
            numAllocated = other.numAllocated;
            other.resetToInternalStorage();
            other.numActive = 0;
        }
        else
        {
            items = getPreallocatedSpace();
            numActive = other.numActive;

            for (size_t i = 0; i < numActive; ++i)
                new (items + i) Item (std::move (other.items[i]));
        }
    }